

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O1

void openJoystickDevice(char *path)

{
  int iVar1;
  int iVar2;
  _GLFWjoystickLinux *p_Var3;
  char *pcVar4;
  float *pfVar5;
  uchar *puVar6;
  long lVar7;
  ulong uVar8;
  char buttonCount;
  char axisCount;
  int version;
  char name [256];
  char local_13e;
  char local_13d;
  int local_13c;
  char local_138 [264];
  
  lVar7 = 0;
  do {
    if ((*(int *)((long)&_glfw.linux_js.js[0].present + lVar7) != 0) &&
       (iVar1 = strcmp(*(char **)((long)&_glfw.linux_js.js[0].path + lVar7),path), iVar1 == 0)) {
      return;
    }
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0x380);
  p_Var3 = &_glfw.linux_js;
  uVar8 = 0;
  do {
    if (p_Var3->js[0].present == 0) goto LAB_0010cd5c;
    uVar8 = uVar8 + 1;
    p_Var3 = (_GLFWjoystickLinux *)(p_Var3->js + 1);
  } while (uVar8 != 0x10);
  uVar8 = 0x10;
LAB_0010cd5c:
  if (((uint)uVar8 < 0x10) && (iVar1 = open(path,0x800), iVar1 != -1)) {
    uVar8 = uVar8 & 0xffffffff;
    _glfw.linux_js.js[uVar8].fd = iVar1;
    ioctl(iVar1,0x80046a01,&local_13c);
    if (local_13c < 0x10000) {
      close(iVar1);
    }
    else {
      iVar2 = ioctl(iVar1,0x81006a13,local_138);
      if (iVar2 < 0) {
        strncpy(local_138,"Unknown",0x100);
      }
      pcVar4 = strdup(local_138);
      _glfw.linux_js.js[uVar8].name = pcVar4;
      pcVar4 = strdup(path);
      _glfw.linux_js.js[uVar8].path = pcVar4;
      ioctl(iVar1,0x80016a11,&local_13d);
      _glfw.linux_js.js[uVar8].axisCount = (int)local_13d;
      ioctl(iVar1,0x80016a12,&local_13e);
      _glfw.linux_js.js[uVar8].buttonCount = (int)local_13e;
      pfVar5 = (float *)calloc((long)local_13d,4);
      _glfw.linux_js.js[uVar8].axes = pfVar5;
      puVar6 = (uchar *)calloc((long)local_13e,1);
      _glfw.linux_js.js[uVar8].buttons = puVar6;
      _glfw.linux_js.js[uVar8].present = 1;
    }
  }
  return;
}

Assistant:

static void openJoystickDevice(const char* path)
{
#if defined(__linux__)
    char axisCount, buttonCount;
    char name[256];
    int joy, fd, version;

    for (joy = GLFW_JOYSTICK_1;  joy <= GLFW_JOYSTICK_LAST;  joy++)
    {
        if (!_glfw.linux_js.js[joy].present)
            continue;

        if (strcmp(_glfw.linux_js.js[joy].path, path) == 0)
            return;
    }

    for (joy = GLFW_JOYSTICK_1;  joy <= GLFW_JOYSTICK_LAST;  joy++)
    {
        if (!_glfw.linux_js.js[joy].present)
            break;
    }

    if (joy > GLFW_JOYSTICK_LAST)
        return;

    fd = open(path, O_RDONLY | O_NONBLOCK);
    if (fd == -1)
        return;

    _glfw.linux_js.js[joy].fd = fd;

    // Verify that the joystick driver version is at least 1.0
    ioctl(fd, JSIOCGVERSION, &version);
    if (version < 0x010000)
    {
        // It's an old 0.x interface (we don't support it)
        close(fd);
        return;
    }

    if (ioctl(fd, JSIOCGNAME(sizeof(name)), name) < 0)
        strncpy(name, "Unknown", sizeof(name));

    _glfw.linux_js.js[joy].name = strdup(name);
    _glfw.linux_js.js[joy].path = strdup(path);

    ioctl(fd, JSIOCGAXES, &axisCount);
    _glfw.linux_js.js[joy].axisCount = (int) axisCount;

    ioctl(fd, JSIOCGBUTTONS, &buttonCount);
    _glfw.linux_js.js[joy].buttonCount = (int) buttonCount;

    _glfw.linux_js.js[joy].axes = calloc(axisCount, sizeof(float));
    _glfw.linux_js.js[joy].buttons = calloc(buttonCount, 1);

    _glfw.linux_js.js[joy].present = GL_TRUE;
#endif // __linux__
}